

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntAutoPtr<Diligent::IThreadPool> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IThreadPool>::operator=
          (RefCntAutoPtr<Diligent::IThreadPool> *this,RefCntAutoPtr<Diligent::IThreadPool> *AutoPtr)

{
  IThreadPool *pIVar1;
  IThreadPool *pObj;
  
  pIVar1 = AutoPtr->m_pObject;
  if (this->m_pObject != pIVar1) {
    AutoPtr->m_pObject = (IThreadPool *)0x0;
    if (this->m_pObject != (IThreadPool *)0x0) {
      (*(this->m_pObject->super_IObject)._vptr_IObject[2])();
      this->m_pObject = (IThreadPool *)0x0;
    }
    this->m_pObject = pIVar1;
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(RefCntAutoPtr&& AutoPtr) noexcept
    {
        if (m_pObject != AutoPtr.m_pObject)
            Attach(AutoPtr.Detach());

        return *this;
    }